

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O3

int getNum(char *str,uint32_t *val,int8_t *opt)

{
  int iVar1;
  int iVar2;
  int8_t iVar3;
  int n;
  intmax_t v;
  int local_2c;
  uint32_t local_28;
  undefined4 uStack_24;
  
  *opt = '\0';
  iVar1 = __isoc99_sscanf(str," %ji %n",&local_28,&local_2c);
  if (iVar1 == 1) {
    *val = local_28;
    *opt = '\x01';
    iVar1 = local_2c;
  }
  else {
    iVar1 = __isoc99_sscanf(str," v%ji %n",&local_28,&local_2c);
    if (iVar1 == 1) {
      *val = local_28;
      *opt = (CONCAT44(uStack_24,local_28) < 0x96) * '\x04' + -2;
      iVar1 = local_2c;
    }
    else {
      iVar2 = __isoc99_sscanf(str," p%ji %n",&local_28,&local_2c);
      iVar1 = 0;
      if (iVar2 == 1) {
        *val = local_28;
        iVar3 = -3;
        if (CONCAT44(uStack_24,local_28) < 10) {
          iVar3 = '\x03';
        }
        *opt = iVar3;
        iVar1 = local_2c;
      }
    }
  }
  return iVar1;
}

Assistant:

static int getNum(char *str, uint32_t *val, int8_t *opt)
{
   int f, n;
   intmax_t v;

   *opt = 0;

   f = sscanf(str, " %ji %n", &v, &n);

   if (f == 1)
   {
      *val = v;
      *opt = CMD_NUMERIC;
      return n;
   }

   f = sscanf(str, " v%ji %n", &v, &n);

   if (f == 1)
   {
      *val = v;
      if (v < PI_MAX_SCRIPT_VARS) *opt = CMD_VAR;
      else *opt = -CMD_VAR;
      return n;
   }

   f = sscanf(str, " p%ji %n", &v, &n);

   if (f == 1)
   {
      *val = v;
      if (v < PI_MAX_SCRIPT_PARAMS) *opt = CMD_PAR;
      else *opt = -CMD_PAR;
      return n;
   }

   return 0;
}